

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_edge_detection.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  undefined2 uVar1;
  undefined2 uVar2;
  uchar *puVar3;
  _func_int **pp_Var4;
  uint32_t uVar5;
  uint8_t uVar6;
  imageException *this;
  EVP_PKEY_CTX *src;
  pointer pPVar7;
  PaintColor local_1d4;
  undefined1 local_1d0 [12];
  uint32_t uStack_1c4;
  uint8_t local_1c0;
  uint8_t uStack_1bf;
  uint32_t local_1bc;
  uchar *local_1b8;
  uint8_t local_1b0;
  EdgeDetection edgeDetection;
  string local_170;
  string filePath;
  Image original;
  EdgeParameter edgeParameter;
  UiWindowX11 window;
  
  filePath._M_dataplus._M_p = (pointer)&filePath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filePath,"mercury.bmp","");
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&filePath,0,(char *)filePath._M_string_length,(ulong)__s);
  }
  Bitmap_Operation::Load(&original,&filePath);
  if (original._data != (uchar *)0x0) {
    local_1d0._0_8_ = &PTR__ImageTemplate_00121b28;
    local_1b8 = (uchar *)0x0;
    local_1b0 = original._type;
    PenguinV_Image::ImageTemplate<unsigned_char>::copy
              ((ImageTemplate<unsigned_char> *)local_1d0,(EVP_PKEY_CTX *)&original,src);
    if (local_1c0 != '\x01') {
      Image_Function::ConvertToGrayScale((Image *)&window,(Image *)local_1d0);
      uVar6 = (uint8_t)window.super_UiWindow._image._data;
      uVar5 = window.super_UiWindow._image._height;
      pp_Var4 = window.super_UiWindow._image._vptr_ImageTemplate;
      puVar3 = local_1b8;
      uVar1 = _local_1c0;
      window.super_UiWindow._image._vptr_ImageTemplate = stack0xfffffffffffffe38;
      stack0xfffffffffffffe38 = pp_Var4;
      local_1c0 = (uint8_t)window.super_UiWindow._image._width;
      uStack_1bf = window.super_UiWindow._image._width._1_1_;
      uVar2 = _local_1c0;
      local_1c0 = (uint8_t)uVar1;
      uStack_1bf = SUB21(uVar1,1);
      window.super_UiWindow._image._width._0_1_ = local_1c0;
      window.super_UiWindow._image._width._1_1_ = uStack_1bf;
      window.super_UiWindow._image._height = local_1bc;
      local_1bc = uVar5;
      local_1b8 = (uchar *)window.super_UiWindow._image._16_8_;
      window.super_UiWindow._image._16_8_ = puVar3;
      window.super_UiWindow._image._data._0_1_ = local_1b0;
      window.super_UiWindow._vptr_UiWindow = (_func_int **)&PTR__ImageTemplate_00121b28;
      local_1b0 = uVar6;
      _local_1c0 = uVar2;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&window);
    }
    EdgeParameter::EdgeParameter(&edgeParameter,LEFT_TO_RIGHT,ANY,ALL,1,1,0,0,'\n');
    edgeParameter.minimumContrast = '@';
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeParameter.contrastCheckLeftSideOffset = 3;
    edgeParameter.contrastCheckRightSideOffset = 3;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    EdgeDetectionBase<double>::find
              (&edgeDetection,(Image *)local_1d0,0,0,local_1d0._8_4_,uStack_1c4,&edgeParameter);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Edge detection","");
    UiWindowX11::UiWindowX11(&window,&original,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p._0_4_ = 0xff14ff14;
    local_1d4.red = 0xff;
    local_1d4.green = '\x14';
    local_1d4.blue = '\x14';
    local_1d4.alpha = 0xff;
    if (edgeDetection.positiveEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        edgeDetection.positiveEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pPVar7 = edgeDetection.positiveEdgePoint.
               super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        UiWindowX11::drawPoint(&window,pPVar7,(PaintColor *)&local_170);
        pPVar7 = pPVar7 + 1;
      } while (pPVar7 != edgeDetection.positiveEdgePoint.
                         super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (edgeDetection.negativeEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        edgeDetection.negativeEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pPVar7 = edgeDetection.negativeEdgePoint.
               super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        UiWindowX11::drawPoint(&window,pPVar7,&local_1d4);
        pPVar7 = pPVar7 + 1;
      } while (pPVar7 != edgeDetection.negativeEdgePoint.
                         super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    UiWindow::show(&window.super_UiWindow);
    UiWindowX11::~UiWindowX11(&window);
    if (edgeDetection.negativeEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(edgeDetection.negativeEdgePoint.
                      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (edgeDetection.positiveEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(edgeDetection.positiveEdgePoint.
                      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_1d0._0_8_ = &PTR__ImageTemplate_00121b28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_1d0);
    original._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filePath._M_dataplus._M_p != &filePath.field_2) {
      operator_delete(filePath._M_dataplus._M_p);
    }
    return 0;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  edgeDetection.positiveEdgePoint.
  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&edgeDetection.positiveEdgePoint.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edgeDetection,"Cannot load ","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&window,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edgeDetection
                 ,&filePath);
  imageException::imageException(this,(string *)&window);
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    try // <---- do not forget to put your code into try.. catch block!
    {
        std::string filePath = "mercury.bmp"; // default image path
        if ( argc > 1 ) // Check input data
            filePath = argv[1];

        const PenguinV_Image::Image original = Bitmap_Operation::Load( filePath );

        if ( original.empty() ) // if the image is empty it means that the image doesn't exist or the file is not readable
            throw imageException( std::string("Cannot load ") + filePath );

        PenguinV_Image::Image image( original );
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE ) // convert to gray-scale image if it's not
            image = Image_Function::ConvertToGrayScale( image );

        EdgeParameter edgeParameter;
        edgeParameter.minimumContrast = 64u; // in intensity grades
        // We know that image would give a lot of false detected points due to single pixel intensity variations
        // In such case we set a range of pixels to verify that found edge point is really an edge
        edgeParameter.contrastCheckLeftSideOffset  = 3u; // in pixels
        edgeParameter.contrastCheckRightSideOffset = 3u; // in pixels

        EdgeDetection edgeDetection;
        edgeDetection.find( image, edgeParameter );

        const std::vector<Point2d> & negativeEdge = edgeDetection.negativeEdge();
        const std::vector<Point2d> & positiveEdge = edgeDetection.positiveEdge();

#if defined (_WIN32)
        UiWindowWin window( original, "Edge detection" );
#else
        UiWindowX11 window( original, "Edge detection" );
#endif

        const PaintColor positiveColor( 20, 255, 20 ); // green
        const PaintColor negativeColor( 255, 20, 20 ); // red

        for ( std::vector<Point2d>::const_iterator point = positiveEdge.cbegin(); point != positiveEdge.cend(); ++point )
            window.drawPoint( *point, positiveColor );

        for ( std::vector<Point2d>::const_iterator point = negativeEdge.cbegin(); point != negativeEdge.cend(); ++point )
            window.drawPoint( *point, negativeColor );

        window.show();
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    return 0;
}